

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_smsb.hpp
# Opt level: O0

uint32_t ans_smsb_undo_mapping(uint32_t x)

{
  uint32_t x_local;
  undefined4 local_4;
  
  local_4 = x;
  if (0x100 < x) {
    if (x < 0x201) {
      local_4 = (x - 0x100) * 0x100;
    }
    else if (x < 0x301) {
      local_4 = (x - 0x200) * 0x10000;
    }
    else {
      local_4 = x << 0x18;
    }
  }
  return local_4;
}

Assistant:

uint32_t ans_smsb_undo_mapping(uint32_t x)
{
    if (x <= 256)
        return x;
    if (x <= 512)
        return ((x - 256) << 8);
    if (x <= 768)
        return ((x - 512) << 16);
    return ((x - 768) << 24);
}